

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O3

streamsize __thiscall
stream::inno_exe_decoder_5200::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_5200 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  char cVar4;
  long lVar5;
  uint32_t uVar6;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  size_t __n;
  uint8_t *__src;
  char *pcVar10;
  char *pcVar11;
  
  cVar4 = this->flush_bytes;
  pcVar10 = dest;
  if (cVar4 < '\x01') {
LAB_0014d14f:
    pcVar11 = dest + n;
joined_r0x0014d155:
    if (pcVar10 == pcVar11) {
      return n;
    }
    cVar4 = this->flush_bytes;
    if (cVar4 != '\0') goto LAB_0014d1cf;
    pbVar3 = *(byte **)&src->field_0x10;
    if (pbVar3 < *(byte **)&src->field_0x18) {
      uVar9 = (uint)*pbVar3;
      *(byte **)&src->field_0x10 = pbVar3 + 1;
    }
    else {
      uVar9 = (**(code **)(*(long *)src + 0x50))(src);
      if (uVar9 == 0xffffffff) {
        uVar9 = src->flags_ | 0xfffffffe;
      }
    }
    if (uVar9 == 0xfffffffe) goto LAB_0014d2db;
    if (uVar9 != 0xffffffff) goto code_r0x0014d19b;
    goto LAB_0014d331;
  }
  if (n != 0) {
    pcVar10 = dest + 1;
    lVar7 = 0;
    do {
      pcVar10[-1] = this->buffer[lVar7];
      cVar4 = this->flush_bytes + -1;
      this->flush_bytes = cVar4;
      if (cVar4 == '\0') goto LAB_0014d14f;
      lVar7 = lVar7 + 1;
      pcVar10 = pcVar10 + 1;
    } while (n != lVar7);
  }
  __src = this->buffer + n;
  __n = (size_t)cVar4;
LAB_0014d2c4:
  memmove(this->buffer,__src,__n);
  return n;
code_r0x0014d19b:
  *pcVar10 = (char)uVar9;
  pcVar10 = pcVar10 + 1;
  uVar2 = this->offset;
  this->offset = uVar2 + 1;
  if ((~uVar2 & 0xfffc) == 0 || uVar9 - 0xea < 0xfffffffe) goto joined_r0x0014d155;
  this->flush_bytes = -4;
  cVar4 = -4;
LAB_0014d1cf:
  lVar5 = (**(code **)(*(long *)src + 0x40))(src,this->buffer + (long)cVar4 + 4,-(long)cVar4);
  lVar7 = -(ulong)(src->flags_ & 1);
  if (lVar5 != 0) {
    lVar7 = lVar5;
  }
  if (lVar7 != -1) {
    uVar6 = (int)lVar7 + this->offset;
    cVar4 = this->flush_bytes + (char)lVar7;
    this->flush_bytes = cVar4;
    this->offset = uVar6;
    if (cVar4 != '\0') {
LAB_0014d2db:
      return (streamsize)(pcVar10 + (n - (long)pcVar11));
    }
    bVar1 = this->buffer[3];
    if ((bVar1 == 0xff) || (bVar1 == 0)) {
      uVar9 = *(uint3 *)this->buffer - uVar6;
      this->buffer[0] = (uint8_t)uVar9;
      this->buffer[1] = (uint8_t)(uVar9 >> 8);
      this->buffer[2] = (uint8_t)(uVar9 >> 0x10);
      if ((this->flip_high_byte == true) && ((uVar9 & 0x800000) != 0)) {
        this->buffer[3] = ~bVar1;
      }
    }
    this->flush_bytes = '\x04';
    if (pcVar10 == pcVar11) {
      __n = 4;
      lVar7 = 0;
LAB_0014d2bd:
      __src = this->buffer + lVar7;
      goto LAB_0014d2c4;
    }
    lVar7 = 0;
    while( true ) {
      pcVar10[lVar7] = this->buffer[lVar7];
      cVar4 = this->flush_bytes + -1;
      this->flush_bytes = cVar4;
      if (cVar4 == '\0') break;
      lVar5 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      if (pcVar10 + lVar5 == pcVar11) {
        __n = (size_t)cVar4;
        goto LAB_0014d2bd;
      }
    }
    pcVar10 = pcVar10 + lVar7 + 1;
    goto joined_r0x0014d155;
  }
  cVar4 = this->flush_bytes + '\x04';
  if (cVar4 < '\x01') goto LAB_0014d331;
  this->flush_bytes = cVar4;
  lVar7 = 0;
  pcVar8 = pcVar10;
  while (pcVar8 != pcVar11) {
    pcVar10[lVar7] = this->buffer[lVar7];
    cVar4 = this->flush_bytes + -1;
    this->flush_bytes = cVar4;
    if (cVar4 == '\0') {
      pcVar10 = pcVar10 + lVar7 + 1;
LAB_0014d331:
      return -(ulong)(pcVar10 + (n - (long)pcVar11) == (char *)0x0) |
             (ulong)(pcVar10 + (n - (long)pcVar11));
    }
    lVar5 = lVar7 + 1;
    lVar7 = lVar7 + 1;
    pcVar8 = pcVar10 + lVar5;
  }
  __src = this->buffer + lVar7;
  __n = (size_t)cVar4;
  goto LAB_0014d2c4;
}

Assistant:

std::streamsize inno_exe_decoder_5200::read(Source & src, char * dest, std::streamsize n) {
	
	char * end = dest + n;
	
	//! Total number of filtered bytes read and written to dest.
#define total_read     (n - (end - dest))
	
#define flush(N) \
	{ \
		if((N) > 0) { \
			flush_bytes = (N); \
			size_t buffer_i = 0; \
			do { \
				if(dest == end) { \
					memmove(buffer, buffer + buffer_i, size_t(flush_bytes)); \
					return total_read; \
				} \
				*dest++ = char(buffer[buffer_i++]); \
			} while(--flush_bytes); \
		} \
	} (void)0
	
	
	// Flush already processed address bytes.
	flush(flush_bytes);
	
	while(dest != end) {
		
		if(!flush_bytes) {
			
			// Check if this is a CALL or JMP instruction.
			int byte = boost::iostreams::get(src);
			if(byte == EOF) { return total_read ? total_read : EOF; }
			if(byte == boost::iostreams::WOULD_BLOCK) { return total_read; }
			*dest++ = char(byte);
			offset++;
			if(byte != 0xe8 && byte != 0xe9) {
				// Not a CALL or JMP instruction.
				continue;
			}
			
			const size_t block_size_left = block_size - ((offset - 1) % block_size);
			if(block_size_left < 5) {
				// Ignore instructions that span blocks.
				continue;
			}
			
			flush_bytes = -4;
		}
		
		assert(flush_bytes < 0);
		
		// Read all four address bytes.
		char * dst = reinterpret_cast<char *>(buffer + 4 + flush_bytes);
		std::streamsize nread = boost::iostreams::read(src, dst, -flush_bytes);
		if(nread == EOF) {
			flush(boost::int8_t(4 + flush_bytes));
			return total_read ? total_read : EOF;
		}
		flush_bytes = boost::int8_t(flush_bytes + nread), offset += boost::uint32_t(nread);
		if(flush_bytes) { return total_read; }
		
		// Verify that the high byte of the address is 0x00 or 00xff.
		if(buffer[3] == 0x00 || buffer[3] == 0xff) {
			
			boost::uint32_t addr = offset & 0xffffff; // may wrap, but OK
			
			boost::uint32_t rel = buffer[0] | (boost::uint32_t(buffer[1]) << 8)
			                                | (boost::uint32_t(buffer[2]) << 16);
			rel -= addr;
			buffer[0] = boost::uint8_t(rel);
			buffer[1] = boost::uint8_t(rel >> 8);
			buffer[2] = boost::uint8_t(rel >> 16);
			
			if(flip_high_byte) {
				// For a slightly higher compression ratio, we want the resulting high
				// byte to be 0x00 for both forward and backward jumps. The high byte
				// of the original relative address is likely to be the sign extension
				// of bit 23, so if bit 23 is set, toggle all bits in the high byte.
				if(rel & 0x800000) {
					buffer[3] = boost::uint8_t(~buffer[3]);
				}
			}
			
		} else {
			// This is most likely not a CALL or JUMP.
		}
		
		flush(4);
	}
	
	return total_read;
	
#undef flush
#undef total_read
	
}